

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

bool CreateStore(ExpressionEvalContext *ctx,ExprBase *target,ExprBase *value)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  TypeBase *pTVar5;
  ExprBase *pEVar6;
  bool bVar7;
  char *msg;
  uint index_1;
  uint index;
  float tmp;
  int local_34;
  uint local_30;
  float local_2c;
  
  uVar2 = (ctx->stackFrames).count;
  if ((uVar2 != 0) && ((ctx->stackFrames).data[uVar2 - 1]->targetYield != 0)) {
    __assert_fail("ctx.stackFrames.back()->targetYield == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x79,"bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)");
  }
  if (target == (ExprBase *)0x0) {
LAB_001484cc:
    target = (ExprBase *)0x0;
  }
  else {
    if (target->typeID == 9) {
      msg = "ERROR: store to null pointer";
      goto LAB_001484b2;
    }
    if ((target == (ExprBase *)0x0) || (target->typeID != 0xc)) goto LAB_001484cc;
  }
  if (target == (ExprBase *)0x0) {
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x84,"bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)");
  }
  uVar1 = value->type->size;
  if (*(ulong *)&target[1].typeID < (long)target[1]._vptr_ExprBase + uVar1) {
    __assert_fail("ptr->ptr + value->type->size <= ptr->end",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x85,"bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)");
  }
  if ((value == (ExprBase *)0x0) || (pEVar6 = value, value->typeID != 3)) {
    pEVar6 = (ExprBase *)0x0;
  }
  if (pEVar6 == (ExprBase *)0x0) {
    if ((value == (ExprBase *)0x0) || (pEVar6 = value, value->typeID != 4)) {
      pEVar6 = (ExprBase *)0x0;
    }
    if (pEVar6 == (ExprBase *)0x0) {
      if ((value == (ExprBase *)0x0) || (pEVar6 = value, value->typeID != 5)) {
        pEVar6 = (ExprBase *)0x0;
      }
      if (pEVar6 != (ExprBase *)0x0) {
        pEVar6 = (ExprBase *)pEVar6[1]._vptr_ExprBase;
        goto LAB_00148522;
      }
      if ((value == (ExprBase *)0x0) || (pEVar6 = value, value->typeID != 6)) {
        pEVar6 = (ExprBase *)0x0;
      }
      if (pEVar6 == (ExprBase *)0x0) {
        if ((value == (ExprBase *)0x0) || (pEVar6 = value, value->typeID != 7)) {
          pEVar6 = (ExprBase *)0x0;
        }
        if (pEVar6 == (ExprBase *)0x0) {
          if ((value == (ExprBase *)0x0) || (pEVar6 = value, value->typeID != 8)) {
            pEVar6 = (ExprBase *)0x0;
          }
          bVar7 = true;
          if (pEVar6 != (ExprBase *)0x0) {
            pTVar5 = (TypeBase *)pEVar6[1]._vptr_ExprBase;
            if ((pTVar5 == (TypeBase *)0x0) ||
               ((pTVar5->typeID != 0 &&
                ((pTVar5 == (TypeBase *)0x0 ||
                 ((pTVar5->typeID != 0x1b &&
                  ((pTVar5 == (TypeBase *)0x0 || (pTVar5->typeID != 0x1c)))))))))) {
              local_30 = ExpressionContext::GetTypeIndex(ctx->ctx,pTVar5);
              memcpy(target[1]._vptr_ExprBase,&local_30,(ulong)(uint)value->type->size);
            }
            else {
              bVar7 = false;
            }
          }
          if (pEVar6 != (ExprBase *)0x0) {
            return bVar7;
          }
          if (value == (ExprBase *)0x0) {
LAB_0014864a:
            pEVar6 = (ExprBase *)0x0;
          }
          else {
            if (value->typeID == 9) {
              memset(target[1]._vptr_ExprBase,0,(ulong)(uint)value->type->size);
              return true;
            }
            if ((value == (ExprBase *)0x0) || (pEVar6 = value, value->typeID != 10))
            goto LAB_0014864a;
          }
          if (pEVar6 != (ExprBase *)0x0) {
            if ((FunctionData *)pEVar6[1]._vptr_ExprBase == (FunctionData *)0x0) {
              local_34 = 0;
            }
            else {
              uVar2 = ExpressionContext::GetFunctionIndex
                                (ctx->ctx,(FunctionData *)pEVar6[1]._vptr_ExprBase);
              local_34 = uVar2 + 1;
            }
            memcpy(target[1]._vptr_ExprBase,&local_34,(ulong)(uint)value->type->size);
            bVar7 = true;
          }
          if (pEVar6 != (ExprBase *)0x0) {
            return bVar7;
          }
          if ((value == (ExprBase *)0x0) || (pEVar6 = value, value->typeID != 0xb)) {
            pEVar6 = (ExprBase *)0x0;
          }
          if (pEVar6 != (ExprBase *)0x0) {
            if ((FunctionData *)pEVar6[1]._vptr_ExprBase == (FunctionData *)0x0) {
              iVar3 = 0;
            }
            else {
              uVar2 = ExpressionContext::GetFunctionIndex
                                (ctx->ctx,(FunctionData *)pEVar6[1]._vptr_ExprBase);
              iVar3 = uVar2 + 1;
            }
            *(int *)target[1]._vptr_ExprBase = iVar3;
            lVar4 = *(long *)&pEVar6[1].typeID;
            if (lVar4 == 0) {
LAB_001486eb:
              lVar4 = 0;
LAB_001486ed:
              if (lVar4 == 0) {
                bVar7 = false;
                goto LAB_0014870a;
              }
              *(undefined8 *)((long)target[1]._vptr_ExprBase + 4) = *(undefined8 *)(lVar4 + 0x30);
            }
            else {
              if (*(int *)(lVar4 + 8) != 9) {
                if ((lVar4 == 0) || (*(int *)(lVar4 + 8) != 0xc)) goto LAB_001486eb;
                goto LAB_001486ed;
              }
              *(undefined8 *)((long)target[1]._vptr_ExprBase + 4) = 0;
            }
            bVar7 = true;
          }
LAB_0014870a:
          if (pEVar6 != (ExprBase *)0x0) {
            return bVar7;
          }
          if ((value == (ExprBase *)0x0) || (pEVar6 = value, value->typeID != 0xc)) {
            pEVar6 = (ExprBase *)0x0;
          }
          if (pEVar6 != (ExprBase *)0x0) {
            pTVar5 = pEVar6->type;
            if ((pTVar5 == (TypeBase *)0x0) || (pTVar5->typeID != 0x12)) {
              pTVar5 = (TypeBase *)0x0;
            }
            if (pTVar5 == (TypeBase *)0x0) {
              __assert_fail("ptrType",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                            ,0xda,
                            "bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)");
            }
            if (*(_func_int **)&pEVar6[1].typeID <
                (_func_int *)((long)pEVar6[1]._vptr_ExprBase + (long)pTVar5[1]._vptr_TypeBase[6])) {
              __assert_fail("expr->ptr + ptrType->subType->size <= expr->end",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                            ,0xdb,
                            "bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)");
            }
            memcpy(target[1]._vptr_ExprBase,pEVar6 + 1,(ulong)(uint)value->type->size);
            bVar7 = true;
          }
          if (pEVar6 != (ExprBase *)0x0) {
            return bVar7;
          }
          if ((value == (ExprBase *)0x0) || (pEVar6 = value, value->typeID != 0xd)) {
            pEVar6 = (ExprBase *)0x0;
          }
          if (pEVar6 != (ExprBase *)0x0) {
            memcpy(target[1]._vptr_ExprBase,pEVar6[1]._vptr_ExprBase[6],
                   (ulong)(uint)value->type->size);
            return true;
          }
          msg = "ERROR: unknown store type";
LAB_001484b2:
          Report(ctx,msg);
          return false;
        }
        if (pEVar6->type == ctx->ctx->typeFloat) {
          local_2c = (float)(double)pEVar6[1]._vptr_ExprBase;
          pEVar6 = (ExprBase *)&local_2c;
          goto LAB_00148522;
        }
      }
      pEVar6 = pEVar6 + 1;
      goto LAB_00148522;
    }
  }
  pEVar6 = (ExprBase *)&pEVar6->field_0x29;
LAB_00148522:
  memcpy(target[1]._vptr_ExprBase,pEVar6,uVar1 & 0xffffffff);
  return true;
}

Assistant:

bool CreateStore(ExpressionEvalContext &ctx, ExprBase *target, ExprBase *value)
{
	// No side-effects while coroutine is skipping to target node
	if(!ctx.stackFrames.empty())
		assert(ctx.stackFrames.back()->targetYield == 0);

	if(isType<ExprNullptrLiteral>(target))
	{
		Report(ctx, "ERROR: store to null pointer");

		return false;
	}

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(target);

	assert(ptr);
	assert(ptr->ptr + value->type->size <= ptr->end);

	if(ExprBoolLiteral *expr = getType<ExprBoolLiteral>(value))
	{
		memcpy(ptr->ptr, &expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprCharacterLiteral *expr = getType<ExprCharacterLiteral>(value))
	{
		memcpy(ptr->ptr, &expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprStringLiteral *expr = getType<ExprStringLiteral>(value))
	{
		memcpy(ptr->ptr, expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprIntegerLiteral *expr = getType<ExprIntegerLiteral>(value))
	{
		memcpy(ptr->ptr, &expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprRationalLiteral *expr = getType<ExprRationalLiteral>(value))
	{
		if(expr->type == ctx.ctx.typeFloat)
		{
			float tmp = float(expr->value);
			memcpy(ptr->ptr, &tmp, unsigned(value->type->size));
			return true;
		}

		memcpy(ptr->ptr, &expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprTypeLiteral *expr = getType<ExprTypeLiteral>(value))
	{
		if(isType<TypeError>(expr->value))
			return false;

		if(isType<TypeArgumentSet>(expr->value) || isType<TypeMemberSet>(expr->value))
			return false;

		unsigned index = ctx.ctx.GetTypeIndex(expr->value);
		memcpy(ptr->ptr, &index, unsigned(value->type->size));
		return true;
	}

	if(isType<ExprNullptrLiteral>(value))
	{
		memset(ptr->ptr, 0, unsigned(value->type->size));
		return true;
	}

	if(ExprFunctionIndexLiteral *expr = getType<ExprFunctionIndexLiteral>(value))
	{
		unsigned index = expr->function ? ctx.ctx.GetFunctionIndex(expr->function) + 1 : 0;
		memcpy(ptr->ptr, &index, unsigned(value->type->size));
		return true;
	}

	if(ExprFunctionLiteral *expr = getType<ExprFunctionLiteral>(value))
	{
		unsigned index = expr->data ? ctx.ctx.GetFunctionIndex(expr->data) + 1 : 0;
		memcpy(ptr->ptr, &index, sizeof(unsigned));

		if(isType<ExprNullptrLiteral>(expr->context))
			memset(ptr->ptr + 4, 0, sizeof(void*));
		else if(ExprPointerLiteral *context = getType<ExprPointerLiteral>(expr->context))
			memcpy(ptr->ptr + 4, &context->ptr, sizeof(void*));
		else
			return false;

		return true;
	}

	if(ExprPointerLiteral *expr = getType<ExprPointerLiteral>(value))
	{
		TypeRef *ptrType = getType<TypeRef>(expr->type);

		(void)ptrType;
		assert(ptrType);
		assert(expr->ptr + ptrType->subType->size <= expr->end);

		memcpy(ptr->ptr, &expr->ptr, unsigned(value->type->size));
		return true;
	}

	if(ExprMemoryLiteral *expr = getType<ExprMemoryLiteral>(value))
	{
		memcpy(ptr->ptr, expr->ptr->ptr, unsigned(value->type->size));
		return true;
	}

	Report(ctx, "ERROR: unknown store type");

	return false;
}